

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.c
# Opt level: O2

IceTImage icetSplitCompose(void)

{
  IceTInt tile;
  uint uVar1;
  IceTImage in_image;
  IceTBoolean IVar2;
  int iVar3;
  IceTSizeType IVar4;
  IceTEnum IVar5;
  IceTEnum IVar6;
  IceTInt *pIVar7;
  IceTBoolean *pIVar8;
  IceTImage IVar9;
  IceTVoid *pIVar10;
  IceTCommRequest pIVar11;
  IceTSparseImage IVar12;
  IceTInt *pIVar13;
  int iVar14;
  int iVar15;
  undefined4 *puVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  IceTSizeType package_size;
  IceTSizeType pixel_size;
  IceTInt num_tiles;
  IceTInt num_proc;
  undefined4 *local_c0;
  IceTInt max_height;
  IceTInt max_width;
  IceTImage local_b0;
  ulong local_a8;
  IceTInt rank;
  long local_98;
  IceTSparseImage local_90;
  IceTImage local_88;
  IceTInt *local_80;
  int local_78;
  IceTInt num_contained_tiles;
  IceTInt tile_displayed;
  IceTInt total_image_count;
  IceTVoid *package_buffer;
  IceTCommRequest local_60 [2];
  IceTVoid *local_50;
  ulong local_48;
  IceTCommRequest *local_40;
  IceTInt *local_38;
  
  icetGetIntegerv(2,&rank);
  icetGetIntegerv(3,&num_proc);
  icetGetIntegerv(0x10,&num_tiles);
  icetGetIntegerv(0x13,&max_width);
  icetGetIntegerv(0x14,&max_height);
  local_80 = icetUnsafeStateGetInteger(0x8a);
  icetGetIntegerv(0x8b,&total_image_count);
  icetGetIntegerv(0x1b,&tile_displayed);
  pIVar7 = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x86,&num_contained_tiles);
  local_38 = icetUnsafeStateGetInteger(0x87);
  pIVar8 = icetUnsafeStateGetBoolean(0x89);
  IVar9 = icetImageNull();
  if (total_image_count < 1) {
    if (-1 < tile_displayed) {
      IVar9 = icetGetStateBufferImage
                        (0x1a4,pIVar7[(ulong)(uint)(tile_displayed << 2) + 2],
                         pIVar7[(ulong)(uint)(tile_displayed << 2) + 3]);
      icetClearImage(IVar9);
    }
  }
  else {
    local_c0 = (undefined4 *)icetGetStateBuffer(0x1a6,num_tiles * 4 + 4);
    pIVar7 = local_80;
    *local_c0 = 0;
    iVar14 = 0;
    for (lVar17 = 0; lVar17 < num_tiles; lVar17 = lVar17 + 1) {
      iVar3 = (num_proc * local_80[lVar17]) / total_image_count;
      iVar15 = 1;
      if (1 < iVar3) {
        iVar15 = iVar3;
      }
      if (local_80[lVar17] < 1) {
        iVar15 = iVar3;
      }
      local_c0[lVar17 + 1] = iVar15;
      iVar14 = iVar14 + iVar15;
    }
    for (; iVar14 < num_proc; iVar14 = iVar14 + 1) {
      fVar23 = (float)num_proc;
      uVar1 = num_tiles;
      if (num_tiles < 1) {
        uVar1 = 0;
      }
      uVar20 = 0xffffffff;
      for (uVar18 = 0; uVar1 != uVar18; uVar18 = uVar18 + 1) {
        if ((local_80[uVar18] != 0) &&
           (fVar24 = (float)(int)local_c0[uVar18 + 1] / (float)local_80[uVar18], fVar24 < fVar23)) {
          uVar20 = uVar18 & 0xffffffff;
          fVar23 = fVar24;
        }
      }
      local_c0[(long)(int)uVar20 + 1] = local_c0[(long)(int)uVar20 + 1] + 1;
    }
    for (; num_proc < iVar14; iVar14 = iVar14 + -1) {
      uVar1 = num_tiles;
      if (num_tiles < 1) {
        uVar1 = 0;
      }
      uVar18 = 0xffffffff;
      uVar20 = 0;
      fVar23 = 0.0;
      while (uVar19 = uVar20, uVar1 != uVar19) {
        uVar20 = uVar19 + 1;
        if ((1 < (int)local_c0[uVar19 + 1]) &&
           (fVar24 = (float)(int)local_c0[uVar19 + 1] / (float)local_80[uVar19], fVar23 < fVar24)) {
          uVar18 = uVar19 & 0xffffffff;
          fVar23 = fVar24;
        }
      }
      local_c0[(long)(int)uVar18 + 1] = local_c0[(long)(int)uVar18 + 1] + -1;
    }
    for (lVar17 = 1; lVar17 < num_tiles; lVar17 = lVar17 + 1) {
      local_c0[lVar17] = local_c0[lVar17] + local_c0[lVar17 + -1];
    }
    local_c0[num_tiles] = num_proc;
    local_48 = 0xffffffffffffffff;
    do {
      lVar17 = local_48 + 2;
      local_48 = local_48 + 1;
    } while ((int)local_c0[lVar17] <= rank);
    uVar20 = local_48 & 0xffffffff;
    iVar15 = local_c0[lVar17] - local_c0[uVar20];
    iVar15 = (max_height * max_width + iVar15 + -1) / iVar15;
    iVar14 = local_80[uVar20];
    IVar4 = icetSparseImageBufferSize(iVar15,1);
    local_50 = icetGetStateBuffer(0x1a1,pIVar7[uVar20] << 3);
    local_90 = icetGetStateBufferSparseImage(0x1a2,max_width,max_height);
    local_78 = iVar15;
    local_b0 = icetGetStateBufferImage(0x1a3,iVar15,1);
    local_88 = icetGetStateBufferImage(0x1a4,max_width,max_height);
    local_40 = (IceTCommRequest *)icetGetStateBuffer(0x1a5,iVar14 << 3);
    local_a8 = uVar20;
    pIVar10 = icetGetStateBuffer(0x1a0,pIVar7[uVar20] * IVar4);
    iVar14 = 0;
    iVar15 = 0;
    while (iVar15 < local_80[local_a8]) {
      if (pIVar8[num_tiles * iVar14 + (int)local_48] != '\0') {
        *(IceTVoid **)((long)local_50 + (long)iVar15 * 8) = pIVar10;
        pIVar11 = icetCommIrecv(pIVar10,IVar4,0x8001,iVar14,0x32);
        local_40[iVar15] = pIVar11;
        iVar15 = iVar15 + 1;
        pIVar10 = (IceTVoid *)((long)pIVar10 + (long)IVar4);
      }
      iVar14 = iVar14 + 1;
    }
    lVar17 = 0;
    puVar16 = local_c0;
    while (pIVar10 = local_50, pIVar7 = local_80, IVar9.opaque_internals = local_88.opaque_internals
          , lVar17 < num_contained_tiles) {
      tile = local_38[lVar17];
      local_98 = lVar17;
      icetGetTileImage(tile,local_88);
      IVar4 = icetImageGetNumPixels(IVar9);
      iVar14 = puVar16[tile];
      iVar15 = puVar16[(long)tile + 1];
      iVar22 = (IVar4 + (iVar15 - iVar14) + -1) / (iVar15 - iVar14);
      iVar3 = 0;
      for (; IVar9.opaque_internals = local_88.opaque_internals, iVar14 < iVar15;
          iVar14 = iVar14 + 1) {
        IVar4 = icetImageGetNumPixels(local_88);
        iVar15 = iVar22;
        if (IVar4 - iVar3 < iVar22) {
          IVar4 = icetImageGetNumPixels(IVar9);
          iVar15 = IVar4 - iVar3;
        }
        IVar12.opaque_internals = local_90.opaque_internals;
        icetCompressSubImage(IVar9,iVar3,iVar15,local_90);
        icetSparseImagePackageForSend(IVar12,&package_buffer,&package_size);
        icetCommSend(package_buffer,package_size,0x8001,iVar14,0x32);
        iVar3 = iVar3 + iVar15;
        iVar15 = local_c0[(long)tile + 1];
        puVar16 = local_c0;
      }
      lVar17 = local_98 + 1;
    }
    bVar21 = false;
    for (iVar14 = 0; iVar14 < pIVar7[local_a8]; iVar14 = iVar14 + 1) {
      iVar15 = icetCommWaitany(pIVar7[local_a8],local_40);
      IVar12 = icetSparseImageUnpackageFromReceive(*(IceTVoid **)((long)pIVar10 + (long)iVar15 * 8))
      ;
      if (bVar21) {
        icetCompressedComposite(local_b0,IVar12,1);
      }
      else {
        icetDecompressImage(IVar12,local_b0);
      }
      bVar21 = true;
    }
    IVar2 = icetIsEnabled(0x146);
    in_image.opaque_internals = local_b0.opaque_internals;
    if (IVar2 == '\0') {
      iVar14 = (rank - local_c0[local_a8]) * local_78;
      IVar4 = icetImageGetNumPixels(local_b0);
      IVar9.opaque_internals = local_88.opaque_internals;
      icetImageCopyPixels(in_image,0,local_88,iVar14,IVar4);
      icetStateSetInteger(0x8c,(IceTInt)local_48);
      icetStateSetInteger(0x8d,iVar14);
      icetStateSetInteger(0x8e,IVar4);
    }
    else {
      icetGetIntegerv(0x1b,&package_size);
      pIVar7 = icetUnsafeStateGetInteger(0x11);
      pIVar13 = icetUnsafeStateGetInteger(0x1a);
      IVar9.opaque_internals = local_b0.opaque_internals;
      IVar4 = icetImageGetNumPixels(local_b0);
      icetImageAdjustForOutput(IVar9);
      IVar5 = icetImageGetColorFormat(IVar9);
      IVar6 = icetImageGetDepthFormat(IVar9);
      icetTimingCollectBegin();
      IVar9.opaque_internals = local_88.opaque_internals;
      local_98 = CONCAT44(local_98._4_4_,IVar5);
      if (IVar5 != 0xc000) {
        pIVar10 = icetImageGetColorVoid(local_b0,&pixel_size);
        package_buffer = icetCommIsend(pIVar10,pixel_size * IVar4,0x8001,pIVar13[local_a8],0x33);
      }
      local_90.opaque_internals._0_4_ = IVar6;
      if (IVar6 != 0xd000) {
        pIVar10 = icetImageGetDepthVoid(local_b0,&pixel_size);
        local_60[0] = icetCommIsend(pIVar10,IVar4 * pixel_size,0x8001,pIVar13[local_a8],0x34);
      }
      if (-1 < package_size) {
        IVar4 = pIVar7[(ulong)(uint)(package_size << 2) + 2];
        iVar14 = pIVar7[(ulong)(uint)(package_size << 2) + 3];
        icetImageAdjustForOutput(IVar9);
        icetImageSetDimensions(IVar9,IVar4,iVar14);
        iVar15 = local_c0[(long)package_size + 1] - local_c0[package_size];
        if (iVar15 == 0 || (int)local_c0[(long)package_size + 1] < (int)local_c0[package_size]) {
          icetClearImage(IVar9);
        }
        else {
          iVar15 = (iVar14 * IVar4 + iVar15 + -1) / iVar15;
          if ((int)local_98 != 0xc000) {
            pIVar10 = icetImageGetColorVoid(IVar9,&pixel_size);
            uVar20 = (ulong)package_size;
            for (iVar14 = local_c0[uVar20]; iVar14 < (int)local_c0[(long)(int)uVar20 + 1];
                iVar14 = iVar14 + 1) {
              icetCommRecv(pIVar10,pixel_size * iVar15,0x8001,iVar14,0x33);
              pIVar10 = (IceTVoid *)((long)pIVar10 + (long)pixel_size * (long)iVar15);
              uVar20 = (ulong)(uint)package_size;
            }
          }
          if ((IceTEnum)local_90.opaque_internals != 0xd000) {
            pIVar10 = icetImageGetDepthVoid(IVar9,&pixel_size);
            uVar20 = (ulong)package_size;
            for (iVar14 = local_c0[uVar20]; iVar14 < (int)local_c0[(long)(int)uVar20 + 1];
                iVar14 = iVar14 + 1) {
              icetCommRecv(pIVar10,pixel_size * iVar15,0x8003,iVar14,0x34);
              pIVar10 = (IceTVoid *)((long)pIVar10 + (long)pixel_size * (long)iVar15);
              uVar20 = (ulong)(uint)package_size;
            }
          }
        }
      }
      if ((int)local_98 != 0xc000) {
        icetCommWait((IceTCommRequest *)&package_buffer);
      }
      if ((IceTEnum)local_90.opaque_internals != 0xd000) {
        icetCommWait(local_60);
      }
      icetTimingCollectEnd();
    }
  }
  return (IceTImage)IVar9.opaque_internals;
}

Assistant:

IceTImage icetSplitCompose(void)
{
    IceTInt *tile_groups;
    IceTInt my_tile;
    IceTInt group_size;
    IceTSizeType my_fragment_size;

    IceTInt rank;
    IceTInt num_proc;
    IceTInt num_tiles;
    IceTInt max_width, max_height;
    const IceTInt *tile_contribs;
    IceTInt total_image_count;
    IceTInt tile_displayed;
    const IceTInt *tile_viewports;
    IceTInt my_width, my_height;

    IceTInt num_contained_tiles;
    const IceTInt *contained_tiles_list;
    const IceTBoolean *all_contained_tiles_masks;

    int tile, image, node;
    int num_allocated;

    IceTSparseImage incoming;
    IceTVoid **incomingBuffers;
    IceTByte *nextInBuf;  /* Use IceTByte for byte-based pointer arithmetic. */
    IceTSparseImage outgoing;
    IceTImage imageFragment;
    IceTImage fullImage;

    IceTSizeType fragmentSparseImageSize;

    int num_requests;
    IceTCommRequest *requests;

    int first_incoming;

    icetRaiseDebug("In splitStrategy");

    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    tile_contribs = icetUnsafeStateGetInteger(ICET_TILE_CONTRIB_COUNTS);
    icetGetIntegerv(ICET_TOTAL_IMAGE_COUNT, &total_image_count);
    icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_NUM_CONTAINED_TILES, &num_contained_tiles);
    contained_tiles_list = icetUnsafeStateGetInteger(ICET_CONTAINED_TILES_LIST);
    all_contained_tiles_masks
        = icetUnsafeStateGetBoolean(ICET_ALL_CONTAINED_TILES_MASKS);

    fullImage = icetImageNull();

  /* Special case: no images rendered whatsoever. */
    if (total_image_count < 1) {
        icetRaiseDebug("Not rendering any images.  Quit early.");
        if (tile_displayed >= 0) {
            my_width = tile_viewports[4*tile_displayed + 2];
            my_height = tile_viewports[4*tile_displayed + 3];
            fullImage = icetGetStateBufferImage(SPLIT_FULL_IMAGE_BUFFER,
                                                my_width, my_height);
            icetClearImage(fullImage);
        }
        return fullImage;
    }

    tile_groups = icetGetStateBuffer(SPLIT_TILE_GROUPS_BUFFER,
                                     sizeof(int)*(num_tiles+1));

    num_allocated = 0;
    tile_groups[0] = 0;
  /* Set entry of tile_groups[i+1] to the number of processes to help
     compose the image in tile i. */
  /* TODO: Consider tile sizes when allocating processes. */
    for (tile = 0; tile < num_tiles; tile++) {
        int allocate = (tile_contribs[tile]*num_proc)/total_image_count;
        if ((allocate < 1) && (tile_contribs[tile] > 0)) {
            allocate = 1;
        }
        tile_groups[tile+1] = allocate;
        num_allocated += allocate;
    }

  /* Make the number of processes allocated equal exactly the number of
     processes available. */
    while (num_allocated < num_proc) {
      /* Add processes to the tile with the lowest process:image ratio. */
        int min_id = -1;
        float min_ratio = (float)num_proc;
        for (tile = 0; tile < num_tiles; tile++) {
            float ratio;
          /* Don't even consider tiles with no contributors. */
            if (tile_contribs[tile] == 0) continue;
            ratio = (float)tile_groups[tile+1]/tile_contribs[tile];
            if (ratio < min_ratio) {
                min_ratio = ratio;
                min_id = tile;
            }
        }
#ifdef DEBUG
        if (min_id < 0) {
            icetRaiseError("Could not find candidate to add tile.",
                           ICET_SANITY_CHECK_FAIL);
        }
#endif
        tile_groups[min_id+1]++;
        num_allocated++;
    }
    while (num_allocated > num_proc) {
      /* Remove processes from the tile with the highest process:image
         ratio. */
        int max_id = -1;
        float max_ratio = 0;
        for (tile = 0; tile < num_tiles; tile++) {
            float ratio;
          /* Don't even consider tiles with a minimum allocation. */
            if (tile_groups[tile+1] <= 1) continue;
            ratio = (float)tile_groups[tile+1]/tile_contribs[tile];
            if (ratio > max_ratio) {
                max_ratio = ratio;
                max_id = tile;
            }
        }
#ifdef DEBUG
        if (max_id < 0) {
            icetRaiseError("Could not find candidate to remove tile.",
                           ICET_SANITY_CHECK_FAIL);
        }
#endif
        tile_groups[max_id+1]--;
        num_allocated--;
    }

  /* Processes are assigned sequentially from 0 to N to each tile as
     needed.  Change each tile_groups[i] entry to be the lowest rank of the
     processes assigned to tile i.  Thus the processes assigned to tile i
     are tile_groups[i] through tile_groups[i+1]-1. */
    for (tile = 1; tile < num_tiles; tile++) {
        tile_groups[tile] += tile_groups[tile-1];
    }
    tile_groups[num_tiles] = num_proc;

  /* Figure out which tile I am assigned to. */
    for (my_tile = 0; rank >= tile_groups[my_tile+1]; my_tile++);
    icetRaiseDebug1("My tile is %d", my_tile);

    group_size = tile_groups[my_tile+1] - tile_groups[my_tile];
    my_width = tile_viewports[4*my_tile + 2];
    my_height = tile_viewports[4*my_tile + 3];
    my_fragment_size = FRAG_SIZE(max_width*max_height, group_size);

    num_requests = tile_contribs[my_tile];

    fragmentSparseImageSize = icetSparseImageBufferSize(my_fragment_size, 1);

    incomingBuffers
        = icetGetStateBuffer(SPLIT_INCOMING_ARRAY_BUFFER,
                             sizeof(IceTVoid*)*tile_contribs[my_tile]);
    outgoing      = icetGetStateBufferSparseImage(SPLIT_OUTGOING_BUFFER,
                                                  max_width, max_height);
    imageFragment = icetGetStateBufferImage(SPLIT_IMAGE_FRAGMENT_BUFFER,
                                            my_fragment_size, 1);
    fullImage     = icetGetStateBufferImage(SPLIT_FULL_IMAGE_BUFFER,
                                            max_width, max_height);
    requests = icetGetStateBuffer(SPLIT_REQUEST_BUFFER,
                                  sizeof(IceTCommRequest)*num_requests);

  /* Set up asynchronous receives for all incoming image fragments. */
    nextInBuf = icetGetStateBuffer(SPLIT_INCOMING_BUFFERS,
                                fragmentSparseImageSize*tile_contribs[my_tile]);
    for (image = 0, node = 0; image < tile_contribs[my_tile]; node++) {
        if (all_contained_tiles_masks[node*num_tiles + my_tile]) {
            icetRaiseDebug1("Setting up receive from node %d", node);
            incomingBuffers[image] = nextInBuf;
            requests[image] =
                icetCommIrecv(incomingBuffers[image],
                              fragmentSparseImageSize,
                              ICET_BYTE, node, IMAGE_DATA);
            image++;
            nextInBuf += fragmentSparseImageSize;
        }
    }

  /* Render and send all tile images I am rendering. */
    for (image = 0; image < num_contained_tiles; image++) {
        IceTSizeType sending_frag_size;
        IceTSizeType offset;

        tile = contained_tiles_list[image];
        icetGetTileImage(tile, fullImage);
        icetRaiseDebug1("Rendered image for tile %d", tile);
        offset = 0;
        sending_frag_size = FRAG_SIZE(icetImageGetNumPixels(fullImage),
                                      tile_groups[tile+1]-tile_groups[tile]);
        for (node = tile_groups[tile]; node < tile_groups[tile+1]; node++) {
            IceTVoid *package_buffer;
            IceTSizeType package_size;
            IceTSizeType truncated_size;

            truncated_size = MIN(sending_frag_size,
                                 icetImageGetNumPixels(fullImage) - offset);

            icetRaiseDebug2("Sending tile %d to node %d", tile, node);
            icetRaiseDebug2("Pixels %d to %d",
                            (int)offset, (int)truncated_size-1);
            icetCompressSubImage(fullImage, offset,
                                 truncated_size, outgoing);
            icetSparseImagePackageForSend(outgoing,
                                          &package_buffer, &package_size);
            icetCommSend(package_buffer, package_size,
                         ICET_BYTE, node, IMAGE_DATA);
            offset += truncated_size;
        }
    }

  /* Wait for images to come in and Z compare them. */
    first_incoming = 1;
    for (image = 0; image < tile_contribs[my_tile]; image++) {
        int idx;
        idx = icetCommWaitany(tile_contribs[my_tile], requests);
        incoming = icetSparseImageUnpackageFromReceive(incomingBuffers[idx]);
        if (first_incoming) {
            icetRaiseDebug1("Got first image (%d).", idx);
            icetDecompressImage(incoming, imageFragment);
            first_incoming = 0;
        } else {
            icetRaiseDebug1("Got subsequent image (%d).", idx);
            icetCompressedComposite(imageFragment, incoming, 1);
        }
    }

    if (icetIsEnabled(ICET_COLLECT_IMAGES)) {
        icetCollectImage(imageFragment,
                         my_tile,
                         tile_groups,
                         fullImage);
    } else {
        IceTSizeType offset;

        offset = (rank - tile_groups[my_tile])*my_fragment_size;

        /* Fragment might be truncated.  Adjust my_fragment_size
           appropriately. */
        my_fragment_size = icetImageGetNumPixels(imageFragment);

        icetImageCopyPixels(imageFragment,
                            0,
                            fullImage,
                            offset,
                            my_fragment_size);

        icetStateSetInteger(ICET_VALID_PIXELS_TILE, my_tile);
        icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, offset);
        icetStateSetInteger(ICET_VALID_PIXELS_NUM, my_fragment_size);
    }

    return fullImage;
}